

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall xLearn::Solver::init_predict(Solver *this)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  index_t iVar4;
  int iVar5;
  void *pvVar6;
  ostream *poVar7;
  undefined8 uVar8;
  string *psVar9;
  reference ppRVar10;
  Score *pSVar11;
  Loss *pLVar12;
  long in_RDI;
  float fVar13;
  Timer timer;
  size_t threadNumber;
  undefined8 in_stack_fffffffffffff948;
  Timer *in_stack_fffffffffffff950;
  allocator *paVar14;
  Timer *in_stack_fffffffffffff960;
  allocator *paVar15;
  value_type *in_stack_fffffffffffff970;
  size_type in_stack_fffffffffffff978;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *in_stack_fffffffffffff980;
  size_t in_stack_fffffffffffff988;
  ThreadPool *in_stack_fffffffffffff990;
  string *in_stack_fffffffffffff9c8;
  undefined8 in_stack_fffffffffffff9d0;
  int line;
  string *in_stack_fffffffffffff9d8;
  undefined8 in_stack_fffffffffffff9e0;
  LogSeverity severity;
  Solver *in_stack_fffffffffffffa20;
  size_t in_stack_fffffffffffffa28;
  Reader *in_stack_fffffffffffffa30;
  string *in_stack_fffffffffffffa58;
  Solver *in_stack_fffffffffffffa60;
  undefined8 in_stack_fffffffffffffb58;
  ThreadPool *in_stack_fffffffffffffb60;
  Score *in_stack_fffffffffffffb68;
  Loss *in_stack_fffffffffffffb70;
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  string local_408 [32];
  Logger local_3e8;
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [32];
  Logger local_398;
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [36];
  Logger local_344;
  string local_340 [32];
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [36];
  Logger local_2ac;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [36];
  Logger local_234;
  Reader *local_230;
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [36];
  Logger local_1ac;
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [48];
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  Logger local_68;
  allocator local_61;
  string local_60 [32];
  string local_40 [48];
  ulong local_10;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffff9e0 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20);
  uVar3 = std::thread::hardware_concurrency();
  local_10 = (ulong)uVar3;
  if (*(int *)(in_RDI + 0x68) != 0) {
    local_10 = (ulong)*(int *)(in_RDI + 0x68);
  }
  pvVar6 = operator_new(0x120);
  ThreadPool::ThreadPool(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
  *(void **)(in_RDI + 0x288) = pvVar6;
  StringPrintf_abi_cxx11_((char *)local_40,"xLearn uses %i threads for prediction task.",local_10);
  bVar2 = SUB81((ulong)in_stack_fffffffffffff948 >> 0x38,0);
  Color::print_info((string *)in_stack_fffffffffffff950,bVar2);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Load model ...",&local_61);
  Color::print_action((string *)in_stack_fffffffffffff950);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 1) {
    Logger::Logger(&local_68,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"init_predict",&local_b1);
    poVar7 = Logger::Start(severity,in_stack_fffffffffffff9d8,line,in_stack_fffffffffffff9c8);
    poVar7 = std::operator<<(poVar7,"CHECK_NE failed ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1a1);
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"hyper_param_.model_file.empty()");
    poVar7 = std::operator<<(poVar7," = ");
    bVar2 = (bool)std::__cxx11::string::empty();
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,bVar2);
    poVar7 = std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<(poVar7,"true");
    poVar7 = std::operator<<(poVar7," = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,true);
    std::operator<<(poVar7,"\n");
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    Logger::~Logger((Logger *)in_stack_fffffffffffff960);
    abort();
  }
  uVar8 = std::__cxx11::string::c_str();
  StringPrintf_abi_cxx11_((char *)local_d8,"Load model from %s",uVar8);
  Color::print_info((string *)in_stack_fffffffffffff950,bVar2);
  std::__cxx11::string::~string(local_d8);
  Timer::Timer(in_stack_fffffffffffff950);
  Timer::tic(in_stack_fffffffffffff950);
  pvVar6 = operator_new(0x90);
  Model::Model((Model *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  *(void **)(in_RDI + 0x248) = pvVar6;
  psVar9 = Model::GetScoreFunction_abi_cxx11_(*(Model **)(in_RDI + 0x248));
  std::__cxx11::string::operator=((string *)(in_RDI + 8),(string *)psVar9);
  psVar9 = Model::GetLossFunction_abi_cxx11_(*(Model **)(in_RDI + 0x248));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),(string *)psVar9);
  iVar4 = Model::GetNumFeature(*(Model **)(in_RDI + 0x248));
  *(index_t *)(in_RDI + 0xb8) = iVar4;
  iVar5 = std::__cxx11::string::compare((char *)(in_RDI + 8));
  if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)(in_RDI + 8)), iVar5 == 0)) {
    iVar4 = Model::GetNumK(*(Model **)(in_RDI + 0x248));
    *(index_t *)(in_RDI + 0xc0) = iVar4;
  }
  iVar5 = std::__cxx11::string::compare((char *)(in_RDI + 8));
  if (iVar5 == 0) {
    iVar4 = Model::GetNumField(*(Model **)(in_RDI + 0x248));
    *(index_t *)(in_RDI + 0xc4) = iVar4;
  }
  uVar8 = std::__cxx11::string::c_str();
  StringPrintf_abi_cxx11_((char *)local_108,"Loss function: %s",uVar8);
  Color::print_info((string *)in_stack_fffffffffffff950,bVar2);
  std::__cxx11::string::~string(local_108);
  uVar8 = std::__cxx11::string::c_str();
  StringPrintf_abi_cxx11_((char *)local_128,"Score function: %s",uVar8);
  Color::print_info((string *)in_stack_fffffffffffff950,bVar2);
  std::__cxx11::string::~string(local_128);
  StringPrintf_abi_cxx11_((char *)local_148,"Number of Feature: %d",(ulong)*(uint *)(in_RDI + 0xb8))
  ;
  Color::print_info((string *)in_stack_fffffffffffff950,bVar2);
  std::__cxx11::string::~string(local_148);
  iVar5 = std::__cxx11::string::compare((char *)(in_RDI + 8));
  if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)(in_RDI + 8)), iVar5 == 0)) {
    StringPrintf_abi_cxx11_((char *)local_168,"Number of K: %d",(ulong)*(uint *)(in_RDI + 0xc0));
    Color::print_info((string *)in_stack_fffffffffffff950,bVar2);
    std::__cxx11::string::~string(local_168);
    iVar5 = std::__cxx11::string::compare((char *)(in_RDI + 8));
    if (iVar5 == 0) {
      StringPrintf_abi_cxx11_
                ((char *)local_188,"Number of field: %d",(ulong)*(uint *)(in_RDI + 0xc4));
      Color::print_info((string *)in_stack_fffffffffffff950,bVar2);
      std::__cxx11::string::~string(local_188);
    }
  }
  fVar13 = Timer::toc(in_stack_fffffffffffff960);
  StringPrintf_abi_cxx11_((char *)(double)fVar13);
  Color::print_info((string *)in_stack_fffffffffffff950,bVar2);
  std::__cxx11::string::~string(local_1a8);
  Logger::Logger(&local_1ac,INFO);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1d0,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
             ,&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"init_predict",&local_1f9);
  poVar7 = Logger::Start(severity,in_stack_fffffffffffff9d8,line,in_stack_fffffffffffff9c8);
  std::operator<<(poVar7,"Initialize model.");
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  Logger::~Logger((Logger *)in_stack_fffffffffffff960);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"Read Problem ...",&local_221);
  Color::print_action((string *)in_stack_fffffffffffff950);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  Timer::reset(in_stack_fffffffffffff960);
  Timer::tic(in_stack_fffffffffffff950);
  local_230 = create_reader(in_stack_fffffffffffffa60);
  std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::resize
            (in_stack_fffffffffffff980,in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  if ((*(byte *)(in_RDI + 0x1ec) & 1) == 0) {
    if (*(long *)(in_RDI + 0x130) == 0) {
      Logger::Logger(&local_2ac,ERR);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                 ,&local_2d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f8,"init_predict",&local_2f9);
      poVar7 = Logger::Start(severity,in_stack_fffffffffffff9d8,line,in_stack_fffffffffffff9c8);
      poVar7 = std::operator<<(poVar7,"CHECK failed ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1e6);
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"hyper_param_.test_dataset");
      std::operator<<(poVar7," == NULL \n");
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      std::__cxx11::string::~string(local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      Logger::~Logger((Logger *)in_stack_fffffffffffff960);
      abort();
    }
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
              ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)(in_RDI + 0x250),0);
    Reader::SetBlockSize(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
    ppRVar10 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                         ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                          (in_RDI + 0x250),0);
    (*(*ppRVar10)->_vptr_Reader[3])(*ppRVar10,in_RDI + 0x130);
    ppRVar10 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                         ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                          (in_RDI + 0x250),0);
    (*(*ppRVar10)->_vptr_Reader[8])(*ppRVar10,0);
    ppRVar10 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                         ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                          (in_RDI + 0x250),0);
    if (*ppRVar10 == (value_type)0x0) {
      uVar8 = std::__cxx11::string::c_str();
      StringPrintf_abi_cxx11_((char *)local_320,"Cannot open the file %s",uVar8);
      Color::print_info((string *)in_stack_fffffffffffff950,bVar2);
      std::__cxx11::string::~string(local_320);
      exit(0);
    }
  }
  else {
    bVar1 = std::__cxx11::string::empty();
    if ((bVar1 & 1) == 1) {
      Logger::Logger(&local_234,ERR);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_258,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                 ,&local_259);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"init_predict",&local_281);
      poVar7 = Logger::Start(severity,in_stack_fffffffffffff9d8,line,in_stack_fffffffffffff9c8);
      poVar7 = std::operator<<(poVar7,"CHECK_NE failed ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1da);
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"hyper_param_.test_set_file.empty()");
      poVar7 = std::operator<<(poVar7," = ");
      bVar2 = (bool)std::__cxx11::string::empty();
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,bVar2);
      poVar7 = std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<(poVar7,"true");
      poVar7 = std::operator<<(poVar7," = ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,true);
      std::operator<<(poVar7,"\n");
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      Logger::~Logger((Logger *)in_stack_fffffffffffff960);
      abort();
    }
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
              ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)(in_RDI + 0x250),0);
    Reader::SetBlockSize(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
    ppRVar10 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                         ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                          (in_RDI + 0x250),0);
    (*(*ppRVar10)->_vptr_Reader[2])(*ppRVar10,in_RDI + 0xe8);
    ppRVar10 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                         ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                          (in_RDI + 0x250),0);
    (*(*ppRVar10)->_vptr_Reader[8])(*ppRVar10,0);
    ppRVar10 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                         ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                          (in_RDI + 0x250),0);
    if (*ppRVar10 == (value_type)0x0) {
      uVar8 = std::__cxx11::string::c_str();
      StringPrintf_abi_cxx11_((char *)local_2a8,"Cannot open the file %s",uVar8);
      Color::print_info((string *)in_stack_fffffffffffff950,bVar2);
      std::__cxx11::string::~string(local_2a8);
      exit(0);
    }
  }
  fVar13 = Timer::toc(in_stack_fffffffffffff960);
  StringPrintf_abi_cxx11_((char *)(double)fVar13);
  Color::print_info((string *)in_stack_fffffffffffff950,bVar2);
  std::__cxx11::string::~string(local_340);
  Logger::Logger(&local_344,INFO);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_368,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
             ,&local_369);
  paVar15 = &local_391;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"init_predict",paVar15);
  poVar7 = Logger::Start(severity,in_stack_fffffffffffff9d8,line,in_stack_fffffffffffff9c8);
  poVar7 = std::operator<<(poVar7,"Initialize Reader: ");
  std::operator<<(poVar7,(string *)(in_RDI + 0xe8));
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  Logger::~Logger((Logger *)in_stack_fffffffffffff960);
  pSVar11 = create_score(in_stack_fffffffffffffa20);
  *(Score **)(in_RDI + 0x270) = pSVar11;
  Logger::Logger(&local_398,INFO);
  paVar15 = &local_3b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3b8,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
             ,paVar15);
  paVar15 = &local_3e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"init_predict",paVar15);
  poVar7 = Logger::Start(severity,in_stack_fffffffffffff9d8,line,in_stack_fffffffffffff9c8);
  std::operator<<(poVar7,"Initialize score function.");
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  Logger::~Logger((Logger *)in_stack_fffffffffffff960);
  pLVar12 = create_loss(in_stack_fffffffffffffa20);
  *(Loss **)(in_RDI + 0x278) = pLVar12;
  Loss::Initialize(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                   SUB81((ulong)in_stack_fffffffffffffb58 >> 0x38,0),
                   SUB81((ulong)in_stack_fffffffffffffb58 >> 0x30,0),
                   (index_t)in_stack_fffffffffffffb58);
  Logger::Logger(&local_3e8,INFO);
  paVar15 = &local_409;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_408,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
             ,paVar15);
  paVar14 = &local_431;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"init_predict",paVar14);
  poVar7 = Logger::Start(severity,in_stack_fffffffffffff9d8,line,in_stack_fffffffffffff9c8);
  std::operator<<(poVar7,"Initialize score function.");
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  Logger::~Logger((Logger *)paVar15);
  return;
}

Assistant:

void Solver::init_predict() {
  /*********************************************************
   *  Initialize thread pool                               *
   *********************************************************/
  size_t threadNumber = std::thread::hardware_concurrency();
  if (hyper_param_.thread_number != 0) {
    threadNumber = hyper_param_.thread_number;
  }
  pool_ = new ThreadPool(threadNumber);
  Color::print_info(
    StringPrintf("xLearn uses %i threads for prediction task.",
             threadNumber)
  );
  /*********************************************************
   *  Read model file                                      *
   *********************************************************/
  Color::print_action("Load model ...");
  CHECK_NE(hyper_param_.model_file.empty(), true);
  Color::print_info(
    StringPrintf("Load model from %s",
          hyper_param_.model_file.c_str())
  );
  Timer timer;
  timer.tic();
  model_ = new Model(hyper_param_.model_file);
  hyper_param_.score_func = model_->GetScoreFunction();
  hyper_param_.loss_func = model_->GetLossFunction();
  hyper_param_.num_feature = model_->GetNumFeature();
  if (hyper_param_.score_func.compare("fm") == 0 ||
       hyper_param_.score_func.compare("ffm") == 0) {
    hyper_param_.num_K = model_->GetNumK();
  }
  if (hyper_param_.score_func.compare("ffm") == 0) {
    hyper_param_.num_field = model_->GetNumField();
  }
  Color::print_info(
    StringPrintf("Loss function: %s", 
      hyper_param_.loss_func.c_str())
  );
  Color::print_info(
    StringPrintf("Score function: %s", 
      hyper_param_.score_func.c_str())
  );
  Color::print_info(
    StringPrintf("Number of Feature: %d", 
                 hyper_param_.num_feature)
  );
  if (hyper_param_.score_func.compare("fm") == 0 ||
      hyper_param_.score_func.compare("ffm") == 0) {
    Color::print_info(
      StringPrintf("Number of K: %d", 
                   hyper_param_.num_K)
    );
    if (hyper_param_.score_func.compare("ffm") == 0) {
      Color::print_info(
        StringPrintf("Number of field: %d", 
                    hyper_param_.num_field)
      );
    }
  }
  Color::print_info(
    StringPrintf("Time cost for loading model: %.2f (sec)",
        timer.toc())
  );
  LOG(INFO) << "Initialize model.";
  /*********************************************************
   *  Initialize Reader and read problem                   *
   *********************************************************/
  Color::print_action("Read Problem ...");
  timer.reset();
  timer.tic();
  // Create Reader
  reader_.resize(1, create_reader());
  if (hyper_param_.from_file) {
    CHECK_NE(hyper_param_.test_set_file.empty(), true);
    reader_[0]->SetBlockSize(hyper_param_.block_size);
    reader_[0]->Initialize(hyper_param_.test_set_file);
    reader_[0]->SetShuffle(false);
    if (reader_[0] == nullptr) {
    Color::print_info(
      StringPrintf("Cannot open the file %s",
                  hyper_param_.test_set_file.c_str())
    );
    exit(0);
    }
  } else {
    CHECK_NOTNULL(hyper_param_.test_dataset)
    reader_[0]->SetBlockSize(hyper_param_.block_size);
    reader_[0]->Initialize(hyper_param_.test_dataset);
    reader_[0]->SetShuffle(false);
    if (reader_[0] == nullptr) {
    Color::print_info(
      StringPrintf("Cannot open the file %s",
                  hyper_param_.test_set_file.c_str())
    );
    exit(0);
    }
  }
  Color::print_info(
    StringPrintf("Time cost for reading problem: %.2f (sec)",
                  timer.toc())
  );
  LOG(INFO) << "Initialize Reader: " << hyper_param_.test_set_file;
  /*********************************************************
   *  Init score function                                  *
   *********************************************************/
  score_ = create_score();
  LOG(INFO) << "Initialize score function.";
  /*********************************************************
   *  Init loss function                                   *
   *********************************************************/
  loss_ = create_loss();
  loss_->Initialize(score_, pool_, hyper_param_.norm);
  LOG(INFO) << "Initialize score function.";
}